

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

longlong mg_store_body(mg_connection *conn,char *path)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_2060 [8];
  mg_file fi;
  int n;
  int ret;
  longlong len;
  char buf [8192];
  char *path_local;
  mg_connection *conn_local;
  
  _n = (mg_connection *)0x0;
  if (conn->consumed_content == 0) {
    fi.access.fp._4_4_ = put_dir(conn,path);
    if (fi.access.fp._4_4_ < 0) {
      conn_local = (mg_connection *)(long)fi.access.fp._4_4_;
    }
    else if (fi.access.fp._4_4_ == 1) {
      iVar1 = mg_fopen(conn,path,2,(mg_file *)local_2060);
      if (iVar1 == 0) {
        conn_local = (mg_connection *)0xfffffffffffffff4;
      }
      else {
        fi.access.fp._4_4_ = mg_read(conn,&len,0x2000);
        while (0 < fi.access.fp._4_4_) {
          sVar2 = fwrite(&len,1,(long)fi.access.fp._4_4_,(FILE *)fi.stat._24_8_);
          fi.access.fp._0_4_ = (int)sVar2;
          if ((int)fi.access.fp != fi.access.fp._4_4_) {
            mg_fclose((mg_file_access *)&fi.stat.location);
            remove_bad_file(conn,path);
            return -0xd;
          }
          _n = (mg_connection *)((_n->request_info).remote_addr + (long)fi.access.fp._4_4_ + -0x48);
          fi.access.fp._4_4_ = mg_read(conn,&len,0x2000);
        }
        iVar1 = mg_fclose((mg_file_access *)&fi.stat.location);
        if (iVar1 == 0) {
          conn_local = _n;
        }
        else {
          remove_bad_file(conn,path);
          conn_local = (mg_connection *)0xfffffffffffffff2;
        }
      }
    }
    else {
      conn_local = (mg_connection *)0x0;
    }
  }
  else {
    mg_cry_internal_wrap
              (conn,(mg_context *)0x0,"mg_store_body",0x2986,"%s: Contents already consumed");
    conn_local = (mg_connection *)0xfffffffffffffff5;
  }
  return (longlong)conn_local;
}

Assistant:

CIVETWEB_API long long
mg_store_body(struct mg_connection *conn, const char *path)
{
	char buf[MG_BUF_LEN];
	long long len = 0;
	int ret, n;
	struct mg_file fi;

	if (conn->consumed_content != 0) {
		mg_cry_internal(conn, "%s: Contents already consumed", __func__);
		return -11;
	}

	ret = put_dir(conn, path);
	if (ret < 0) {
		/* -1 for path too long,
		 * -2 for path can not be created. */
		return ret;
	}
	if (ret != 1) {
		/* Return 0 means, path itself is a directory. */
		return 0;
	}

	if (mg_fopen(conn, path, MG_FOPEN_MODE_WRITE, &fi) == 0) {
		return -12;
	}

	ret = mg_read(conn, buf, sizeof(buf));
	while (ret > 0) {
		n = (int)fwrite(buf, 1, (size_t)ret, fi.access.fp);
		if (n != ret) {
			(void)mg_fclose(
			    &fi.access); /* File is bad and will be removed anyway. */
			remove_bad_file(conn, path);
			return -13;
		}
		len += ret;
		ret = mg_read(conn, buf, sizeof(buf));
	}

	/* File is open for writing. If fclose fails, there was probably an
	 * error flushing the buffer to disk, so the file on disk might be
	 * broken. Delete it and return an error to the caller. */
	if (mg_fclose(&fi.access) != 0) {
		remove_bad_file(conn, path);
		return -14;
	}

	return len;
}